

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateInterfaceMembers
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  
  field = this->descriptor_;
  if ((*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) || (*(long *)(field + 0x60) == 0)) {
    WriteFieldDocComment(printer,field);
    io::Printer::Print(printer,&this->variables_,"$deprecation$boolean has$capitalized_name$();\n");
  }
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,"$deprecation$$type$ get$capitalized_name$();\n");
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$$type$OrBuilder get$capitalized_name$OrBuilder();\n");
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::
GenerateInterfaceMembers(io::Printer* printer) const {
  // TODO(jonp): In the future, consider having a method specific to the
  // interface so that builders can choose dynamically to either return a
  // message or a nested builder, so that asking for the interface doesn't
  // cause a message to ever be built.
  if (SupportFieldPresence(descriptor_->file()) ||
      descriptor_->containing_oneof() == NULL) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$boolean has$capitalized_name$();\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$$type$ get$capitalized_name$();\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$$type$OrBuilder get$capitalized_name$OrBuilder();\n");
}